

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm1394.cpp
# Opt level: O1

int GetMenuChoice(AmpIO *Board,string *mcsName)

{
  size_type sVar1;
  long lVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  long lVar8;
  char *pcVar9;
  termios savedTerm;
  termios newTerm;
  string local_d8;
  termios local_b4;
  termios local_78;
  
  iVar5 = 0;
  tcgetattr(0,&local_b4);
  local_78.c_iflag = local_b4.c_iflag;
  local_78.c_oflag = local_b4.c_oflag;
  local_78.c_line = local_b4.c_line;
  local_78.c_cc[0] = local_b4.c_cc[0];
  local_78.c_cc[1] = local_b4.c_cc[1];
  local_78.c_cc[2] = local_b4.c_cc[2];
  local_78.c_cc[3] = local_b4.c_cc[3];
  local_78.c_cc[4] = local_b4.c_cc[4];
  local_78.c_cc[5] = local_b4.c_cc[5];
  local_78.c_cc[6] = local_b4.c_cc[6];
  local_78.c_cc[7] = local_b4.c_cc[7];
  local_78.c_cc[8] = local_b4.c_cc[8];
  local_78.c_cc[9] = local_b4.c_cc[9];
  local_78.c_cc[10] = local_b4.c_cc[10];
  local_78.c_cc[0xb] = local_b4.c_cc[0xb];
  local_78.c_cc[0xc] = local_b4.c_cc[0xc];
  local_78.c_cc[0xd] = local_b4.c_cc[0xd];
  local_78.c_cc[0xe] = local_b4.c_cc[0xe];
  local_78.c_cc[0xf] = local_b4.c_cc[0xf];
  local_78.c_cc[0x10] = local_b4.c_cc[0x10];
  local_78.c_cc[0x11] = local_b4.c_cc[0x11];
  local_78.c_cc[0x12] = local_b4.c_cc[0x12];
  local_78.c_cc[0x13] = local_b4.c_cc[0x13];
  local_78.c_cc[0x14] = local_b4.c_cc[0x14];
  local_78.c_cc[0x15] = local_b4.c_cc[0x15];
  local_78.c_cc[0x16] = local_b4.c_cc[0x16];
  local_78.c_ispeed = local_b4.c_ispeed;
  local_78.c_ospeed = local_b4.c_ospeed;
  local_78._8_8_ = local_b4._8_8_ & 0xfffffffdffffffff;
  tcsetattr(0,0,&local_78);
  uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)Board);
  uVar4 = BoardIO::GetHardwareVersion((BoardIO *)Board);
  sVar1 = mcsName->_M_string_length;
  do {
    if (iVar5 != 0) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Invalid option -- try again",0x1b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Board: ",7);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
    BoardIO::GetHardwareVersionString_abi_cxx11_(&local_d8,(BoardIO *)Board);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_d8._M_dataplus._M_p,local_d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (sVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"0) Exit programmer",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      if (uVar4 == 0x44514c41) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"4) Program QLA 1 SN",0x13);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
        std::ostream::put('@');
        poVar6 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"5) Program QLA 2 SN",0x13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        poVar6 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"6) Read FPGA SN",0xf);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        poVar6 = (ostream *)std::ostream::flush();
        lVar8 = 0x12;
        pcVar9 = "7) Read QLA 1+2 SN";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"5) Program QLA SN",0x11);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
        std::ostream::put('@');
        poVar6 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"6) Read FPGA SN",0xf);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        poVar6 = (ostream *)std::ostream::flush();
        lVar8 = 0xe;
        pcVar9 = "7) Read QLA SN";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,lVar8);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MCS file: ",10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(mcsName->_M_dataplus)._M_p,
                          mcsName->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PROM Id: ",9);
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      FpgaIO::PromGetId(&Board->super_FpgaIO);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      lVar8 = *(long *)poVar6;
      lVar2 = *(long *)(lVar8 + -0x18);
      *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 2;
      std::ios::widen((char)*(undefined8 *)(lVar8 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      plVar7 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"0) Exit programmer",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"1) Program PROM",0xf);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"2) Verify PROM",0xe);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"3) Read PROM data",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"4) Program FPGA SN",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"5) Program QLA SN",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"6) Read FPGA SN",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"7) Read QLA SN",0xe);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (uVar3 < 7) {
        lVar8 = 0x12;
        pcVar9 = "8) Exit programmer";
      }
      else {
        lVar8 = 0x17;
        pcVar9 = "8) Reboot FPGA and exit";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar8);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"9) Download PROM to MCS file",0x1c);
      poVar6 = (ostream *)&std::cout;
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Select option: ",0xf);
    iVar5 = getchar();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  } while (iVar5 - 0x3aU < 0xfffffff6);
  tcsetattr(0,0,&local_b4);
  return iVar5 + -0x30;
}

Assistant:

int GetMenuChoice(AmpIO &Board, const std::string &mcsName)
{
#ifndef _MSC_VER
    struct termios savedTerm, newTerm;
    tcgetattr(STDIN_FILENO, &savedTerm);
    newTerm = savedTerm;
    newTerm.c_lflag &= ~ICANON;  // turn off line buffering
    tcsetattr(STDIN_FILENO, TCSANOW, &newTerm);  // change terminal settings
#endif

    uint32_t fver = Board.GetFirmwareVersion();
    uint32_t hver = Board.GetHardwareVersion();
    bool fpgaV3 = mcsName.empty();
    int c = 0;
    while ((c < '0') || (c > '9')) {
        if (c) {
            std::cout << std::endl << "Invalid option -- try again" << std::endl;
        }
        std::cout << std::endl
                  << "Board: " << (unsigned int)Board.GetBoardId()
                  << " (" << Board.GetHardwareVersionString() << ")" << std::endl;
        if (!fpgaV3) {
            std::cout << "MCS file: " << mcsName << std::endl;
            std::cout << "PROM Id: " << std::hex << Board.PromGetId() << std::dec
                      << std::endl << std::endl;
        }

        std::cout << "0) Exit programmer" << std::endl;
        if (!fpgaV3) {
            std::cout << "1) Program PROM" << std::endl
                      << "2) Verify PROM" << std::endl
                      << "3) Read PROM data" << std::endl
                      << "4) Program FPGA SN" << std::endl
                      << "5) Program QLA SN" << std::endl
                      << "6) Read FPGA SN" << std::endl
                      << "7) Read QLA SN" << std::endl;
            if (fver >= 7)
                std::cout << "8) Reboot FPGA and exit" << std::endl;
            else
                std::cout << "8) Exit programmer" << std::endl;
            std::cout << "9) Download PROM to MCS file" << std::endl;
        }
        else {
            // With FPGA V3, we can only program or read the QLA PROM,
            // or read the FPGA S/N
            if (hver == DQLA_String) {
                std::cout << "4) Program QLA 1 SN" << std::endl
                          << "5) Program QLA 2 SN" << std::endl
                          << "6) Read FPGA SN" << std::endl
                          << "7) Read QLA 1+2 SN" << std::endl;
            }
            else {
                std::cout << "5) Program QLA SN" << std::endl
                          << "6) Read FPGA SN" << std::endl
                          << "7) Read QLA SN" << std::endl;
            }
        }
        std::cout << std::endl;

        std::cout << "Select option: ";
#ifdef _MSC_VER
        c = _getche();
#else
        c = getchar();
#endif
        std::cout << std::endl;
    }

#ifndef _MSC_VER
    tcsetattr(STDIN_FILENO, TCSANOW, &savedTerm);  // restore terminal settings
#endif
    return (c-'0');
}